

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O0

void __thiscall UDMFParser::ParseSidedef(UDMFParser *this,side_t *sd,intmapsidedef_t *sdt,int index)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  double dVar4;
  FName local_40;
  undefined1 local_3c [8];
  FName key;
  double texOfs [2];
  int index_local;
  intmapsidedef_t *sdt_local;
  side_t *sd_local;
  UDMFParser *this_local;
  
  memset(local_3c + 4,0,0x10);
  memset(sd,0,0xd8);
  FString::operator=(&sdt->bottomtexture,"-");
  FString::operator=(&sdt->toptexture,"-");
  FString::operator=(&sdt->midtexture,"-");
  side_t::SetTextureXScale(sd,1.0);
  side_t::SetTextureYScale(sd,1.0);
  sd->Index = index;
  FScanner::MustGetToken((FScanner *)this,0x7b);
  do {
    bVar1 = FScanner::CheckToken((FScanner *)this,0x7d);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      side_t::AddTextureXOffset(sd,0,stack0xffffffffffffffc8);
      side_t::AddTextureXOffset(sd,1,stack0xffffffffffffffc8);
      side_t::AddTextureXOffset(sd,2,stack0xffffffffffffffc8);
      side_t::AddTextureYOffset(sd,0,texOfs[0]);
      side_t::AddTextureYOffset(sd,1,texOfs[0]);
      side_t::AddTextureYOffset(sd,2,texOfs[0]);
      return;
    }
    UDMFParserBase::ParseKey((UDMFParserBase *)local_3c,SUB81(this,0),(bool *)0x0);
    iVar2 = FName::operator_cast_to_int((FName *)local_3c);
    switch(iVar2) {
    case 0x119:
      pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
      iVar2 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar3);
      register0x00001200 = (double)iVar2;
      break;
    case 0x11a:
      pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
      iVar2 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar3);
      texOfs[0] = (double)iVar2;
      break;
    case 0x11b:
      pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
      pcVar3 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar3);
      FString::operator=(&sdt->toptexture,pcVar3);
      break;
    case 0x11c:
      pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
      pcVar3 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar3);
      FString::operator=(&sdt->bottomtexture,pcVar3);
      break;
    case 0x11d:
      pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
      pcVar3 = UDMFParserBase::CheckString(&this->super_UDMFParserBase,pcVar3);
      FString::operator=(&sdt->midtexture,pcVar3);
      break;
    case 0x11e:
      pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
      iVar2 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar3);
      sd->sector = (sector_t *)(long)iVar2;
      break;
    default:
      if (((this->super_UDMFParserBase).namespace_bits & 0x70U) == 0) {
LAB_006e2ed9:
        if (((this->super_UDMFParserBase).namespace_bits & 0x30U) != 0) {
          pcVar3 = FName::GetChars((FName *)local_3c);
          iVar2 = strncasecmp("user_",pcVar3,5);
          if (iVar2 == 0) {
            FName::FName(&local_40,(FName *)local_3c);
            AddUserKey(this,&local_40,1,index);
          }
        }
      }
      else {
        iVar2 = FName::operator_cast_to_int((FName *)local_3c);
        switch(iVar2) {
        case 0x124:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          UDMFParserBase::Flag<unsigned_char>(&this->super_UDMFParserBase,&sd->Flags,2,pcVar3);
          break;
        default:
          goto LAB_006e2ed9;
        case 0x168:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          UDMFParserBase::Flag<unsigned_char>(&this->super_UDMFParserBase,&sd->Flags,0x10,pcVar3);
          break;
        case 0x169:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          UDMFParserBase::Flag<unsigned_char>(&this->super_UDMFParserBase,&sd->Flags,0x20,pcVar3);
          break;
        case 0x19c:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          dVar4 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar3);
          side_t::SetTextureXOffset(sd,0,dVar4);
          break;
        case 0x19d:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          dVar4 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar3);
          side_t::SetTextureYOffset(sd,0,dVar4);
          break;
        case 0x19e:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          dVar4 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar3);
          side_t::SetTextureXOffset(sd,1,dVar4);
          break;
        case 0x19f:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          dVar4 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar3);
          side_t::SetTextureYOffset(sd,1,dVar4);
          break;
        case 0x1a0:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          dVar4 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar3);
          side_t::SetTextureXOffset(sd,2,dVar4);
          break;
        case 0x1a1:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          dVar4 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar3);
          side_t::SetTextureYOffset(sd,2,dVar4);
          break;
        case 0x1a2:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          dVar4 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar3);
          side_t::SetTextureXScale(sd,0,dVar4);
          break;
        case 0x1a3:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          dVar4 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar3);
          side_t::SetTextureYScale(sd,0,dVar4);
          break;
        case 0x1a4:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          dVar4 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar3);
          side_t::SetTextureXScale(sd,1,dVar4);
          break;
        case 0x1a5:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          dVar4 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar3);
          side_t::SetTextureYScale(sd,1,dVar4);
          break;
        case 0x1a6:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          dVar4 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar3);
          side_t::SetTextureXScale(sd,2,dVar4);
          break;
        case 0x1a7:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          dVar4 = UDMFParserBase::CheckFloat(&this->super_UDMFParserBase,pcVar3);
          side_t::SetTextureYScale(sd,2,dVar4);
          break;
        case 0x1a8:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          iVar2 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar3);
          side_t::SetLight(sd,(SWORD)iVar2);
          break;
        case 0x1a9:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          UDMFParserBase::Flag<unsigned_char>(&this->super_UDMFParserBase,&sd->Flags,1,pcVar3);
          break;
        case 0x1aa:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          UDMFParserBase::Flag<unsigned_char>(&this->super_UDMFParserBase,&sd->Flags,0x80,pcVar3);
          break;
        case 0x1ab:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          UDMFParserBase::Flag<unsigned_char>(&this->super_UDMFParserBase,&sd->Flags,4,pcVar3);
          break;
        case 0x1ac:
          pcVar3 = FName::operator_cast_to_char_((FName *)local_3c);
          UDMFParserBase::Flag<unsigned_char>(&this->super_UDMFParserBase,&sd->Flags,8,pcVar3);
        }
      }
    }
  } while( true );
}

Assistant:

void ParseSidedef(side_t *sd, intmapsidedef_t *sdt, int index)
	{
		double texOfs[2]={0,0};

		memset(sd, 0, sizeof(*sd));
		sdt->bottomtexture = "-";
		sdt->toptexture = "-";
		sdt->midtexture = "-";
		sd->SetTextureXScale(1.);
		sd->SetTextureYScale(1.);
		sd->Index = index;

		sc.MustGetToken('{');
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Offsetx:
				texOfs[0] = CheckInt(key);
				continue;

			case NAME_Offsety:
				texOfs[1] = CheckInt(key);
				continue;

			case NAME_Texturetop:
				sdt->toptexture = CheckString(key);
				continue;

			case NAME_Texturebottom:
				sdt->bottomtexture = CheckString(key);
				continue;

			case NAME_Texturemiddle:
				sdt->midtexture = CheckString(key);
				continue;

			case NAME_Sector:
				sd->sector = (sector_t*)(intptr_t)CheckInt(key);
				continue;

			default:
				break;
			}

			if (namespace_bits & (Zd|Zdt|Va)) switch(key)
			{
			case NAME_offsetx_top:
				sd->SetTextureXOffset(side_t::top, CheckFloat(key));
				continue;

			case NAME_offsety_top:
				sd->SetTextureYOffset(side_t::top, CheckFloat(key));
				continue;

			case NAME_offsetx_mid:
				sd->SetTextureXOffset(side_t::mid, CheckFloat(key));
				continue;

			case NAME_offsety_mid:
				sd->SetTextureYOffset(side_t::mid, CheckFloat(key));
				continue;

			case NAME_offsetx_bottom:
				sd->SetTextureXOffset(side_t::bottom, CheckFloat(key));
				continue;

			case NAME_offsety_bottom:
				sd->SetTextureYOffset(side_t::bottom, CheckFloat(key));
				continue;

			case NAME_scalex_top:
				sd->SetTextureXScale(side_t::top, CheckFloat(key));
				continue;

			case NAME_scaley_top:
				sd->SetTextureYScale(side_t::top, CheckFloat(key));
				continue;

			case NAME_scalex_mid:
				sd->SetTextureXScale(side_t::mid, CheckFloat(key));
				continue;

			case NAME_scaley_mid:
				sd->SetTextureYScale(side_t::mid, CheckFloat(key));
				continue;

			case NAME_scalex_bottom:
				sd->SetTextureXScale(side_t::bottom, CheckFloat(key));
				continue;

			case NAME_scaley_bottom:
				sd->SetTextureYScale(side_t::bottom, CheckFloat(key));
				continue;

			case NAME_light:
				sd->SetLight(CheckInt(key));
				continue;

			case NAME_lightabsolute:
				Flag(sd->Flags, WALLF_ABSLIGHTING, key);
				continue;

			case NAME_lightfog:
				Flag(sd->Flags, WALLF_LIGHT_FOG, key);
				continue;

			case NAME_nofakecontrast:
				Flag(sd->Flags, WALLF_NOFAKECONTRAST, key);
				continue;

			case NAME_smoothlighting:
				Flag(sd->Flags, WALLF_SMOOTHLIGHTING, key);
				continue;

			case NAME_Wrapmidtex:
				Flag(sd->Flags, WALLF_WRAP_MIDTEX, key);
				continue;

			case NAME_Clipmidtex:
				Flag(sd->Flags, WALLF_CLIP_MIDTEX, key);
				continue;

			case NAME_Nodecals:
				Flag(sd->Flags, WALLF_NOAUTODECALS, key);
				continue;

			default:
				break;

			}
			if ((namespace_bits & (Zd | Zdt)) && !strnicmp("user_", key.GetChars(), 5))
			{
				AddUserKey(key, UDMF_Side, index);
			}
		}
		// initialization of these is delayed to allow separate offsets and add them with the global ones.
		sd->AddTextureXOffset(side_t::top, texOfs[0]);
		sd->AddTextureXOffset(side_t::mid, texOfs[0]);
		sd->AddTextureXOffset(side_t::bottom, texOfs[0]);
		sd->AddTextureYOffset(side_t::top, texOfs[1]);
		sd->AddTextureYOffset(side_t::mid, texOfs[1]);
		sd->AddTextureYOffset(side_t::bottom, texOfs[1]);
	}